

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

xmlChar * htmlParseNameComplex(xmlParserCtxtPtr ctxt)

{
  int iVar1;
  xmlChar *pxVar2;
  bool bVar3;
  uint local_38;
  xmlChar *base;
  int count;
  int c;
  int l;
  int len;
  xmlParserCtxtPtr ctxt_local;
  
  c = 0;
  base._0_4_ = 0;
  pxVar2 = ctxt->input->base;
  _l = ctxt;
  if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlParserInputGrow(ctxt->input,0xfa);
  }
  base._4_4_ = htmlCurrentChar(_l,&count);
  if (((base._4_4_ == 0x20) || (base._4_4_ == 0x3e)) || (base._4_4_ == 0x2f)) {
LAB_00162101:
    ctxt_local = (xmlParserCtxtPtr)0x0;
  }
  else {
    if ((int)base._4_4_ < 0x100) {
      if (((((((int)base._4_4_ < 0x41) || (0x5a < (int)base._4_4_)) &&
            (((int)base._4_4_ < 0x61 || (0x7a < (int)base._4_4_)))) &&
           (((int)base._4_4_ < 0xc0 || (0xd6 < (int)base._4_4_)))) &&
          (((int)base._4_4_ < 0xd8 || (0xf6 < (int)base._4_4_)))) && ((int)base._4_4_ < 0xf8)) {
LAB_001620b5:
        if (((((int)base._4_4_ < 0x100) ||
             (((((int)base._4_4_ < 0x4e00 || (0x9fa5 < (int)base._4_4_)) && (base._4_4_ != 0x3007))
              && (((int)base._4_4_ < 0x3021 || (0x3029 < (int)base._4_4_)))))) &&
            (base._4_4_ != 0x5f)) && (base._4_4_ != 0x3a)) goto LAB_00162101;
      }
    }
    else {
      iVar1 = xmlCharInRange(base._4_4_,&xmlIsBaseCharGroup);
      if (iVar1 == 0) goto LAB_001620b5;
    }
    do {
      bVar3 = false;
      if (((base._4_4_ != 0x20) && (bVar3 = false, base._4_4_ != 0x3e)) &&
         (bVar3 = false, base._4_4_ != 0x2f)) {
        if ((int)base._4_4_ < 0x100) {
          if (((((int)base._4_4_ < 0x41) || (bVar3 = true, 0x5a < (int)base._4_4_)) &&
              (((int)base._4_4_ < 0x61 || (bVar3 = true, 0x7a < (int)base._4_4_)))) &&
             ((((int)base._4_4_ < 0xc0 || (bVar3 = true, 0xd6 < (int)base._4_4_)) &&
              ((((int)base._4_4_ < 0xd8 || (bVar3 = true, 0xf6 < (int)base._4_4_)) &&
               (bVar3 = true, (int)base._4_4_ < 0xf8)))))) {
LAB_001621e4:
            if (((int)base._4_4_ < 0x100) ||
               (((((int)base._4_4_ < 0x4e00 || (bVar3 = true, 0x9fa5 < (int)base._4_4_)) &&
                 (bVar3 = true, base._4_4_ != 0x3007)) &&
                (((int)base._4_4_ < 0x3021 || (bVar3 = true, 0x3029 < (int)base._4_4_)))))) {
              if ((int)base._4_4_ < 0x100) {
                if (((int)base._4_4_ < 0x30) || (bVar3 = true, 0x39 < (int)base._4_4_)) {
LAB_0016228c:
                  bVar3 = true;
                  if ((base._4_4_ != 0x2e) &&
                     (((bVar3 = true, base._4_4_ != 0x2d && (bVar3 = true, base._4_4_ != 0x5f)) &&
                      (bVar3 = true, base._4_4_ != 0x3a)))) {
                    if (0xff < (int)base._4_4_) {
                      iVar1 = xmlCharInRange(base._4_4_,&xmlIsCombiningGroup);
                      bVar3 = true;
                      if (iVar1 != 0) goto LAB_00162333;
                    }
                    if ((int)base._4_4_ < 0x100) {
                      local_38 = (uint)(base._4_4_ == 0xb7);
                    }
                    else {
                      local_38 = xmlCharInRange(base._4_4_,&xmlIsExtenderGroup);
                    }
                    bVar3 = local_38 != 0;
                  }
                }
              }
              else {
                iVar1 = xmlCharInRange(base._4_4_,&xmlIsDigitGroup);
                bVar3 = true;
                if (iVar1 == 0) goto LAB_0016228c;
              }
            }
          }
        }
        else {
          iVar1 = xmlCharInRange(base._4_4_,&xmlIsBaseCharGroup);
          bVar3 = true;
          if (iVar1 == 0) goto LAB_001621e4;
        }
      }
LAB_00162333:
      if (!bVar3) {
        if ((long)_l->input->cur - (long)_l->input->base < (long)c) {
          htmlParseErr(_l,XML_ERR_INTERNAL_ERROR,"unexpected change of input buffer",(xmlChar *)0x0,
                       (xmlChar *)0x0);
          return (xmlChar *)0x0;
        }
        pxVar2 = xmlDictLookup(_l->dict,_l->input->cur + -(long)c,c);
        return pxVar2;
      }
      bVar3 = 100 < (int)base;
      base._0_4_ = (int)base + 1;
      if (((bVar3) && (base._0_4_ = 0, _l->progressive == 0)) &&
         ((long)_l->input->end - (long)_l->input->cur < 0xfa)) {
        xmlParserInputGrow(_l->input,0xfa);
      }
      c = count + c;
      if (*_l->input->cur == '\n') {
        _l->input->line = _l->input->line + 1;
        _l->input->col = 1;
      }
      else {
        _l->input->col = _l->input->col + 1;
      }
      _l->token = 0;
      _l->input->cur = _l->input->cur + count;
      base._4_4_ = htmlCurrentChar(_l,&count);
    } while (_l->input->base == pxVar2);
    ctxt_local = (xmlParserCtxtPtr)htmlParseNameComplex(_l);
  }
  return (xmlChar *)ctxt_local;
}

Assistant:

static const xmlChar *
htmlParseNameComplex(xmlParserCtxtPtr ctxt) {
    int len = 0, l;
    int c;
    int count = 0;
    const xmlChar *base = ctxt->input->base;

    /*
     * Handler for more complex cases
     */
    GROW;
    c = CUR_CHAR(l);
    if ((c == ' ') || (c == '>') || (c == '/') || /* accelerators */
	(!IS_LETTER(c) && (c != '_') &&
         (c != ':'))) {
	return(NULL);
    }

    while ((c != ' ') && (c != '>') && (c != '/') && /* test bigname.xml */
	   ((IS_LETTER(c)) || (IS_DIGIT(c)) ||
            (c == '.') || (c == '-') ||
	    (c == '_') || (c == ':') ||
	    (IS_COMBINING(c)) ||
	    (IS_EXTENDER(c)))) {
	if (count++ > 100) {
	    count = 0;
	    GROW;
	}
	len += l;
	NEXTL(l);
	c = CUR_CHAR(l);
	if (ctxt->input->base != base) {
	    /*
	     * We changed encoding from an unknown encoding
	     * Input buffer changed location, so we better start again
	     */
	    return(htmlParseNameComplex(ctxt));
	}
    }

    if (ctxt->input->cur - ctxt->input->base < len) {
        /* Sanity check */
	htmlParseErr(ctxt, XML_ERR_INTERNAL_ERROR,
                     "unexpected change of input buffer", NULL, NULL);
        return (NULL);
    }

    return(xmlDictLookup(ctxt->dict, ctxt->input->cur - len, len));
}